

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

Matrix44<double> * __thiscall Imath_2_5::Euler<double>::toMatrix44(Euler<double> *this)

{
  double *pdVar1;
  Vec3<double> *in_RSI;
  Matrix44<double> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double ss;
  double sc;
  double cs;
  double cc;
  double sh;
  double sj;
  double si;
  double ch;
  double cj;
  double ci;
  Vec3<double> angles;
  int k;
  int j;
  int i;
  Matrix44<double> *M;
  Matrix44<double> *in_stack_fffffffffffffec0;
  Vec3<double> local_50;
  Vec3<double> local_38;
  int local_1c;
  int local_18;
  int local_14 [5];
  
  angleOrder((Euler<double> *)in_RSI,local_14,&local_18,&local_1c);
  Vec3<double>::Vec3(&local_38);
  if (((ulong)in_RSI[1].x & 1) == 0) {
    Vec3<double>::Vec3(&local_50,in_RSI->z,in_RSI->y,in_RSI->x);
    Vec3<double>::operator=(&local_38,&local_50);
  }
  else {
    Vec3<double>::operator=(&local_38,in_RSI);
  }
  if ((*(byte *)&in_RSI[1].x >> 2 & 1) == 0) {
    Vec3<double>::operator*=(&local_38,-1.0);
  }
  dVar2 = Math<double>::cos(local_38.x);
  dVar3 = Math<double>::cos(local_38.y);
  dVar4 = Math<double>::cos(local_38.z);
  dVar5 = Math<double>::sin(local_38.x);
  dVar6 = Math<double>::sin(local_38.y);
  dVar7 = Math<double>::sin(local_38.z);
  dVar8 = dVar2 * dVar4;
  dVar9 = dVar2 * dVar7;
  dVar10 = dVar5 * dVar4;
  dVar11 = dVar5 * dVar7;
  Matrix44<double>::Matrix44(in_stack_fffffffffffffec0);
  if ((*(byte *)&in_RSI[1].x >> 1 & 1) == 0) {
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_14[0]] = dVar3 * dVar4;
    dVar4 = dVar6 * dVar10 + -dVar9;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_14[0]] = dVar4;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_14[0]] = dVar6 * dVar8 + dVar11;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_18] = dVar3 * dVar7;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_18] = dVar6 * dVar11 + dVar8;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_18] = dVar6 * dVar9 + -dVar10;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_1c] = -dVar6;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_1c] = dVar3 * dVar5;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_1c] = dVar3 * dVar2;
  }
  else {
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_14[0]] = dVar3;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_14[0]] = dVar6 * dVar5;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_14[0]] = dVar6 * dVar2;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_18] = dVar6 * dVar7;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_18] = -dVar3 * dVar11 + dVar8;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_18] = -dVar3 * dVar9 + -dVar10;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_14[0]);
    pdVar1[local_1c] = -dVar6 * dVar4;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_18);
    pdVar1[local_1c] = dVar3 * dVar10 + dVar9;
    pdVar1 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar1[local_1c] = dVar3 * dVar8 + -dVar11;
  }
  return in_RDI;
}

Assistant:

Matrix44<T> Euler<T>::toMatrix44() const
{
    int i,j,k;
    angleOrder(i,j,k);

    Vec3<T> angles;

    if ( _frameStatic ) angles = (*this);
    else angles = Vec3<T>(z,y,x);

    if ( !_parityEven ) angles *= -1.0;

    T ci = Math<T>::cos(angles.x);
    T cj = Math<T>::cos(angles.y);
    T ch = Math<T>::cos(angles.z);
    T si = Math<T>::sin(angles.x);
    T sj = Math<T>::sin(angles.y);
    T sh = Math<T>::sin(angles.z);

    T cc = ci*ch;
    T cs = ci*sh;
    T sc = si*ch;
    T ss = si*sh;

    Matrix44<T> M;

    if ( _initialRepeated )
    {
	M[i][i] = cj;	  M[j][i] =  sj*si;    M[k][i] =  sj*ci;
	M[i][j] = sj*sh;  M[j][j] = -cj*ss+cc; M[k][j] = -cj*cs-sc;
	M[i][k] = -sj*ch; M[j][k] =  cj*sc+cs; M[k][k] =  cj*cc-ss;
    }
    else
    {
	M[i][i] = cj*ch; M[j][i] = sj*sc-cs; M[k][i] = sj*cc+ss;
	M[i][j] = cj*sh; M[j][j] = sj*ss+cc; M[k][j] = sj*cs-sc;
	M[i][k] = -sj;	 M[j][k] = cj*si;    M[k][k] = cj*ci;
    }

    return M;
}